

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O3

void avro::codec_traits<umu::_union_map_union_Union__0__>::encode
               (Encoder *e,_union_map_union_Union__0__ *v)

{
  string local_38;
  
  (**(code **)(*(long *)e + 0xa0))(e,v->idx_);
  if (v->idx_ != 1) {
    if (v->idx_ == 0) {
      umu::_union_map_union_Union__0__::get_string_abi_cxx11_(&local_38,v);
      (**(code **)(*(long *)e + 0x50))(e,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  (**(code **)(*(long *)e + 0x20))(e);
  return;
}

Assistant:

static void encode(Encoder& e, umu::_union_map_union_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            avro::encode(e, v.get_string());
            break;
        case 1:
            e.encodeNull();
            break;
        }
    }